

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> __thiscall
libtorrent::aux::http_parser::header_duration(http_parser *this,string_view key)

{
  const_iterator cVar1;
  ulong uVar2;
  _Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> _Var3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = key._M_str;
  local_18._M_len = key._M_len;
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->m_header,&local_18);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    _Var3._M_payload = (_Storage<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
  }
  else {
    uVar2 = atol(*(char **)(cVar1._M_node + 2));
    _Var3 = (_Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>)
            (uVar2 & 0xffffffff | (ulong)(0 < (long)uVar2) << 0x20);
  }
  return (optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>)_Var3;
}

Assistant:

std::optional<seconds32> http_parser::header_duration(string_view const key) const
	{
		// at least GCC-5.4 for ARM (on travis) has a libstdc++ whose debug map$
		// doesn't seem to support transparent comparators$
#if ! defined _GLIBCXX_DEBUG
		auto const i = m_header.find(key);
#else
		auto const i = m_header.find(std::string(key));
#endif
		if (i == m_header.end()) return std::nullopt;
		auto const val = std::atol(i->second.c_str());
		if (val <= 0) return std::nullopt;
		return seconds32(val);
	}